

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitting.hpp
# Opt level: O3

pair<eos::core::Mesh,_eos::fitting::RenderingParameters> *
eos::fitting::fit_shape_and_pose
          (pair<eos::core::Mesh,_eos::fitting::RenderingParameters> *__return_storage_ptr__,
          MorphableModel *morphable_model,LandmarkCollection<Eigen::Vector2f> *landmarks,
          LandmarkMapper *landmark_mapper,int image_width,int image_height,
          EdgeTopology *edge_topology,ContourLandmarks *contour_landmarks,
          ModelContour *model_contour,int num_iterations,optional<int> num_shape_coefficients_to_fit
          ,float lambda_identity,optional<int> num_expression_coefficients_to_fit,
          optional<float> lambda_expressions,
          vector<float,_std::allocator<float>_> *pca_shape_coefficients,
          vector<float,_std::allocator<float>_> *expression_coefficients,
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          *fitted_image_points)

{
  optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  *landmark_definitions;
  float *pfVar1;
  float *pfVar2;
  pointer pfVar3;
  pointer pfVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  pointer pMVar12;
  pair<eos::core::Mesh,_eos::fitting::RenderingParameters> *ppVar13;
  pointer piVar14;
  pointer piVar15;
  pointer pMVar16;
  _Optional_payload_base<int> _Var17;
  Index IVar18;
  uint uVar19;
  pointer pMVar20;
  pointer paVar21;
  pointer paVar22;
  pointer pLVar23;
  float *pfVar24;
  undefined8 *puVar25;
  runtime_error *this;
  ulong uVar26;
  _Storage<int,_true> *p_Var27;
  _Optional_payload_base<float> filter;
  pointer pMVar28;
  float *pfVar29;
  long lVar30;
  void *pvVar31;
  ulong uVar32;
  int iVar33;
  void *pvVar34;
  optional<int> vertex_idx;
  VectorXf current_combined_shape;
  VectorXf current_pca_shape;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  model_points;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  occluding_contour_landmarks;
  pair<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::vector<int,_std::allocator<int>_>_>
  edge_correspondences;
  ScaledOrthoProjectionParameters current_pose;
  VectorXf mean_plus_expressions;
  vector<int,_std::allocator<int>_> fixed_vertex_indices;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  fixed_image_points;
  RenderingParameters rendering_params;
  Matrix<float,_3,_4,_0,_3,_4> affine_from_ortho_1;
  Matrix<float,_3,_4,_0,_3,_4> affine_from_ortho;
  vector<int,_std::allocator<int>_> local_678;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  local_658;
  void *local_640;
  _Storage<int,_true> local_638;
  undefined4 uStack_634;
  undefined8 uStack_630;
  pointer local_628;
  pointer pMStack_620;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  pointer local_608;
  _Optional_payload_base<float> _Stack_600;
  _Optional_payload_base<float> local_5f8;
  pointer paStack_5f0;
  pointer paStack_5e8;
  pointer local_5e0;
  pointer local_5d8;
  pointer paStack_5d0;
  pointer local_5c8;
  pointer local_5c0;
  pointer paStack_5b8;
  pointer local_5b0;
  _Optional_payload_base<int> local_5a8;
  VectorXf local_5a0;
  int local_58c;
  core *local_588;
  void *local_580;
  VectorXf local_578;
  ExpressionModel *local_568;
  uint local_560;
  _Storage<int,_true> local_55c;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_558;
  _Optional_payload_base<int> local_540;
  undefined1 local_538 [4];
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  pointer local_528;
  float local_514;
  float local_510;
  int local_50c;
  Mesh local_508;
  pair<eos::core::Mesh,_eos::fitting::RenderingParameters> *local_478;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *local_470;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *local_468;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *local_460;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *local_458;
  VectorXf *local_450;
  long local_448;
  long local_440;
  undefined1 local_438 [16];
  pointer local_428;
  pointer local_420;
  pointer local_418;
  pointer local_410;
  Nested local_3f8;
  Nested pMStack_3f0;
  pointer local_3e8;
  pointer pMStack_3e0;
  float local_3d8;
  float local_3d4;
  float fStack_3d0;
  float local_3cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_3c0;
  _Optional_payload_base<int> local_3b8;
  void *local_3b0;
  long local_3a8;
  DenseStorage<float,__1,__1,_1,_0> local_3a0;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  local_390;
  vector<int,_std::allocator<int>_> local_378;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  local_360;
  vector<float,_std::allocator<float>_> local_348;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_330;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  local_318;
  vector<float,_std::allocator<float>_> local_300;
  undefined1 local_2e8 [16];
  float local_2d8;
  float local_2c8 [2];
  float afStack_2c0 [2];
  pointer local_2b8;
  _Optional_payload_base<float> _Stack_2b0;
  _Optional_payload_base<float> local_2a8;
  pointer paStack_2a0;
  string local_290;
  vector<float,_std::allocator<float>_> local_270;
  vector<float,_std::allocator<float>_> local_258;
  vector<float,_std::allocator<float>_> local_240;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_228;
  vector<float,_std::allocator<float>_> local_210;
  DenseStorage<float,__1,__1,_1,_0> local_1f8;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  Matrix4f local_1d8;
  Nested local_198;
  Nested pMStack_190;
  pointer local_188;
  pointer pMStack_180;
  float local_178;
  float local_174;
  float fStack_170;
  float local_16c;
  Matrix<float,_3,_4,_0,_3,_4> local_168;
  Nested local_138;
  Nested pMStack_130;
  float local_128;
  float local_118 [2];
  float afStack_110 [2];
  pointer local_108;
  _Optional_payload_base<float> _Stack_100;
  _Optional_payload_base<float> local_f8;
  pointer paStack_f0;
  Matrix<float,_3,_4,_0,_3,_4> local_e8;
  Nested local_b8;
  Nested pMStack_b0;
  pointer local_a8;
  pointer pMStack_a0;
  float local_98;
  float local_94;
  float fStack_90;
  float local_8c;
  Nested local_88;
  Nested pMStack_80;
  float local_78;
  float local_68 [2];
  float afStack_60 [2];
  pointer local_58;
  _Optional_payload_base<float> _Stack_50;
  _Optional_payload_base<float> local_48;
  pointer paStack_40;
  
  local_5a8 = (_Optional_payload_base<int>)morphable_model;
  local_588 = (core *)landmarks;
  local_514 = lambda_identity;
  if ((ulong)(((long)(landmarks->
                     super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(landmarks->
                     super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) < 4) {
    __assert_fail("landmarks.size() >= 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/fitting.hpp"
                  ,0x104,
                  "std::pair<core::Mesh, fitting::RenderingParameters> eos::fitting::fit_shape_and_pose(const morphablemodel::MorphableModel &, const core::LandmarkCollection<Eigen::Vector2f> &, const core::LandmarkMapper &, int, int, const morphablemodel::EdgeTopology &, const fitting::ContourLandmarks &, const fitting::ModelContour &, int, cpp17::optional<int>, float, cpp17::optional<int>, cpp17::optional<float>, std::vector<float> &, std::vector<float> &, std::vector<Eigen::Vector2f> &)"
                 );
  }
  local_58c = image_width;
  if ((image_width < 1) || (image_height < 1)) {
    __assert_fail("image_width > 0 && image_height > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/fitting.hpp"
                  ,0x105,
                  "std::pair<core::Mesh, fitting::RenderingParameters> eos::fitting::fit_shape_and_pose(const morphablemodel::MorphableModel &, const core::LandmarkCollection<Eigen::Vector2f> &, const core::LandmarkMapper &, int, int, const morphablemodel::EdgeTopology &, const fitting::ContourLandmarks &, const fitting::ModelContour &, int, cpp17::optional<int>, float, cpp17::optional<int>, cpp17::optional<float>, std::vector<float> &, std::vector<float> &, std::vector<Eigen::Vector2f> &)"
                 );
  }
  local_478 = __return_storage_ptr__;
  if (num_iterations < 1) {
    __assert_fail("num_iterations > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/fitting.hpp"
                  ,0x106,
                  "std::pair<core::Mesh, fitting::RenderingParameters> eos::fitting::fit_shape_and_pose(const morphablemodel::MorphableModel &, const core::LandmarkCollection<Eigen::Vector2f> &, const core::LandmarkMapper &, int, int, const morphablemodel::EdgeTopology &, const fitting::ContourLandmarks &, const fitting::ModelContour &, int, cpp17::optional<int>, float, cpp17::optional<int>, cpp17::optional<float>, std::vector<float> &, std::vector<float> &, std::vector<Eigen::Vector2f> &)"
                 );
  }
  pfVar3 = (pca_shape_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pfVar4 = (pca_shape_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pvVar31 = (void *)(morphable_model->shape_model).rescaled_pca_basis.
                    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols
  ;
  if ((ulong)(long)(int)pvVar31 < (ulong)((long)pfVar4 - (long)pfVar3 >> 2)) {
    __assert_fail("pca_shape_coefficients.size() <= morphable_model.get_shape_model().get_num_principal_components()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/fitting.hpp"
                  ,0x107,
                  "std::pair<core::Mesh, fitting::RenderingParameters> eos::fitting::fit_shape_and_pose(const morphablemodel::MorphableModel &, const core::LandmarkCollection<Eigen::Vector2f> &, const core::LandmarkMapper &, int, int, const morphablemodel::EdgeTopology &, const fitting::ContourLandmarks &, const fitting::ModelContour &, int, cpp17::optional<int>, float, cpp17::optional<int>, cpp17::optional<float>, std::vector<float> &, std::vector<float> &, std::vector<Eigen::Vector2f> &)"
                 );
  }
  pvVar34 = (void *)((ulong)num_shape_coefficients_to_fit.super__Optional_base<int,_true,_true>.
                            _M_payload.super__Optional_payload_base<int> >> 0x20);
  if (((ulong)pvVar34 & 1) == 0) {
    pvVar34 = (void *)CONCAT71(num_shape_coefficients_to_fit.super__Optional_base<int,_true,_true>.
                               _M_payload.super__Optional_payload_base<int>._1_7_ >> 0x20,1);
    local_540._M_payload = (_Storage<int,_true>)0x0;
    local_540._M_engaged = false;
    local_540._5_3_ = 0;
  }
  else {
    if ((int)pvVar31 <
        num_shape_coefficients_to_fit.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_payload) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,
                 "Specified more shape coefficients to fit than the given shape model contains.");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_540 = (_Optional_payload_base<int>)
                ((ulong)num_shape_coefficients_to_fit.super__Optional_base<int,_true,_true>.
                        _M_payload.super__Optional_payload_base<int> & 0xffffff0000000000);
    pvVar31 = (void *)((ulong)num_shape_coefficients_to_fit.super__Optional_base<int,_true,_true>.
                              _M_payload.super__Optional_payload_base<int> & 0xffffffff);
  }
  if (pfVar3 == pfVar4) {
    if (((ulong)pvVar34 & 1) == 0) {
      std::__throw_bad_optional_access();
    }
    std::vector<float,_std::allocator<float>_>::resize(pca_shape_coefficients,(long)(int)pvVar31);
  }
  local_640 = pvVar34;
  std::vector<float,_std::allocator<float>_>::vector(&local_210,pca_shape_coefficients);
  morphablemodel::PcaModel::draw_sample
            ((PcaModel *)&local_578,(vector<float,_std::allocator<float>_> *)local_5a8);
  if (local_210.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_210.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_210.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_210.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(char *)((long)local_5a8 + 0x140) == '\0') {
    __assert_fail("morphable_model.has_separate_expression_model()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/fitting.hpp"
                  ,300,
                  "std::pair<core::Mesh, fitting::RenderingParameters> eos::fitting::fit_shape_and_pose(const morphablemodel::MorphableModel &, const core::LandmarkCollection<Eigen::Vector2f> &, const core::LandmarkMapper &, int, int, const morphablemodel::EdgeTopology &, const fitting::ContourLandmarks &, const fitting::ModelContour &, int, cpp17::optional<int>, float, cpp17::optional<int>, cpp17::optional<float>, std::vector<float> &, std::vector<float> &, std::vector<Eigen::Vector2f> &)"
                 );
  }
  std::vector<float,_std::allocator<float>_>::vector(&local_300,expression_coefficients);
  local_568 = (ExpressionModel *)((long)local_5a8 + 0xd0);
  morphablemodel::draw_sample((morphablemodel *)&local_638,local_568,&local_300);
  local_508.vertices.
  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_578;
  local_508.vertices.
  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_638;
  if ((_Storage<int,_true> *)
      local_578.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
      uStack_630) {
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::Matrix<float,_1,1,0,_1,1>const>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&local_5a0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                *)&local_508);
    free((void *)_local_638);
    if (local_300.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_300.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_300.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_300.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_450 = (VectorXf *)((long)local_5a8 + 0x68);
    local_458 = (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                ((long)local_5a8 + 0x50);
    local_460 = (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                ((long)local_5a8 + 0xb8);
    local_468 = (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                ((long)local_5a8 + 0x188);
    local_470 = (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                ((long)local_5a8 + 0x1a0);
    local_580 = pvVar31;
    local_560 = image_height;
    morphablemodel::sample_to_mesh
              (&local_508,&local_5a0,local_450,local_458,local_460,local_468,local_470);
    local_558.
    super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (Matrix<float,_4,_1,_0,_4,_1> *)0x0;
    local_558.
    super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (Matrix<float,_4,_1,_0,_4,_1> *)0x0;
    local_558.
    super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (Matrix<float,_4,_1,_0,_4,_1> *)0x0;
    local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_658.
    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_658.
    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_658.
    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pLVar23 = *(pointer *)local_588;
    if (*(pointer *)(local_588 + 8) != pLVar23) {
      landmark_definitions =
           (optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
            *)((long)local_5a8 + 0x148);
      lVar30 = 0x20;
      uVar32 = 0;
      do {
        lVar5 = *(long *)((long)(&pLVar23->coordinates + -8) + lVar30);
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_290,lVar5,
                   *(long *)((long)(&pLVar23->coordinates + -7) + lVar30) + lVar5);
        _local_638 = (_Optional_payload_base<int>)
                     core::get_vertex_index(&local_290,landmark_mapper,landmark_definitions);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p == &local_290.field_2) {
          uVar26 = (ulong)_local_638 >> 0x20;
        }
        else {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
          uVar26 = (ulong)_local_638 >> 0x20 & 0xff;
        }
        if ((uVar26 & 1) != 0) {
          local_2e8._0_8_ =
               (long)local_638._M_value * 0xc +
               (long)local_508.vertices.
                     super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          std::vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>
          ::emplace_back<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>>
                    ((vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>
                      *)&local_558,(Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0> *)local_2e8)
          ;
          if (uStack_634._0_1_ == false) {
            std::__throw_bad_optional_access();
          }
          if (local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_678,
                       (iterator)
                       local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_638._M_value);
          }
          else {
            *local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = (int)local_638;
            local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
          ::emplace_back<Eigen::Matrix<float,2,1,0,2,1>const&>
                    ((vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
                      *)&local_658,(Matrix<float,_2,_1,_0,_2,_1> *)(*(long *)local_588 + lVar30));
        }
        uVar32 = uVar32 + 1;
        pLVar23 = *(pointer *)local_588;
        uVar26 = ((long)*(pointer *)(local_588 + 8) - (long)pLVar23 >> 3) * -0x3333333333333333;
        lVar30 = lVar30 + 0x28;
      } while (uVar32 <= uVar26 && uVar26 - uVar32 != 0);
    }
    std::
    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ::vector(&local_318,&local_658);
    std::
    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ::vector(&local_330,&local_558);
    uVar19 = local_560;
    local_3b8 = (_Optional_payload_base<int>)((ulong)local_560 | 0x100000000);
    estimate_orthographic_projection_linear
              ((ScaledOrthoProjectionParameters *)&local_3f8,&local_318,&local_330,true,
               (optional<int>)local_3b8);
    if (local_330.
        super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_330.
                      super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_330.
                            super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_330.
                            super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_318.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_318.
                      super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_318.
                            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_318.
                            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    iVar33 = local_58c;
    local_b8 = local_3f8;
    pMStack_b0 = pMStack_3f0;
    local_a8 = local_3e8;
    pMStack_a0 = pMStack_3e0;
    local_98 = local_3d8;
    local_94 = local_3d4;
    fStack_90 = fStack_3d0;
    local_8c = local_3cc;
    RenderingParameters::RenderingParameters
              ((RenderingParameters *)local_2e8,(ScaledOrthoProjectionParameters *)&local_b8,
               local_58c,uVar19);
    local_88 = (Nested)local_2e8._0_8_;
    pMStack_80 = (Nested)local_2e8._8_8_;
    local_78 = local_2d8;
    local_68[0] = local_2c8[0];
    local_68[1] = local_2c8[1];
    afStack_60[0] = afStack_2c0[0];
    afStack_60[1] = afStack_2c0[1];
    local_58 = local_2b8;
    _Stack_50 = _Stack_2b0;
    local_48 = local_2a8;
    paStack_40 = paStack_2a0;
    get_3x4_affine_camera_matrix(&local_e8,(RenderingParameters *)&local_88,iVar33,uVar19);
    _Var17 = local_5a8;
    if (*(char *)((long)local_5a8 + 0x140) == '\0') {
      std::__throw_bad_optional_access();
    }
    fit_expressions((vector<float,_std::allocator<float>_> *)&local_638,local_568,&local_578,
                    &local_e8,&local_658,&local_678,lambda_expressions,
                    num_expression_coefficients_to_fit);
    pfVar3 = (expression_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar4 = (expression_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (expression_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)_local_638;
    (expression_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)uStack_630;
    (expression_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_628;
    local_638 = (_Storage<int,_true>)0x0;
    uStack_634._0_1_ = false;
    uStack_634._1_3_ = 0;
    uStack_630 = (_Storage<int,_true> *)0x0;
    local_628 = (pointer)0x0;
    if ((pfVar3 != (pointer)0x0) &&
       (operator_delete(pfVar3,(long)pfVar4 - (long)pfVar3),
       _local_638 != (_Optional_payload_base<int>)0x0)) {
      operator_delete((void *)_local_638,(long)local_628 - (long)_local_638);
    }
    if (*(char *)((long)_Var17 + 0x140) == '\0') {
      std::__throw_bad_optional_access();
    }
    std::vector<float,_std::allocator<float>_>::vector(&local_348,expression_coefficients);
    morphablemodel::draw_sample((morphablemodel *)&local_638,local_568,&local_348);
    IVar18 = local_578.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    pfVar29 = local_578.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
              m_data;
    _Var17 = _local_638;
    if ((_Storage<int,_true> *)
        local_578.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
        uStack_630) {
      if (local_5a0.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != local_578.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows) {
        if (local_578.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            < 0) {
LAB_00157364:
          __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                        ,0x115,
                        "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, 1>]"
                       );
        }
        free(local_5a0.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
        if ((_Storage<int,_true> *)IVar18 == (_Storage<int,_true> *)0x0) {
          pfVar24 = (float *)0x0;
        }
        else {
          if ((_Storage<int,_true> *)0x3fffffffffffffff < (ulong)IVar18) {
LAB_00155e71:
            puVar25 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar25 = boost::program_options::detail::cmdline::cmdline;
            __cxa_throw(puVar25,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          pfVar24 = (float *)malloc(IVar18 * 4);
          if ((_Storage<int,_true> *)0x3 < (ulong)IVar18 && ((ulong)pfVar24 & 0xf) != 0) {
LAB_00157383:
            __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/util/Memory.h"
                          ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
          }
          if (pfVar24 == (float *)0x0) goto LAB_00155e71;
        }
        local_5a0.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             IVar18;
        local_5a0.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             pfVar24;
      }
      p_Var27 = (_Storage<int,_true> *)(IVar18 + 3);
      if (-1 < IVar18) {
        p_Var27 = (_Storage<int,_true> *)IVar18;
      }
      p_Var27 = (_Storage<int,_true> *)((ulong)p_Var27 & 0xfffffffffffffffc);
      if (3 < IVar18) {
        lVar30 = 0;
        do {
          pfVar24 = pfVar29 + lVar30;
          fVar6 = pfVar24[1];
          fVar7 = pfVar24[2];
          fVar8 = pfVar24[3];
          pfVar1 = (float *)((long)_Var17 + lVar30 * 4);
          fVar9 = pfVar1[1];
          fVar10 = pfVar1[2];
          fVar11 = pfVar1[3];
          pfVar2 = local_5a0.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage
                   .m_data + lVar30;
          *pfVar2 = *pfVar24 + *pfVar1;
          pfVar2[1] = fVar6 + fVar9;
          pfVar2[2] = fVar7 + fVar10;
          pfVar2[3] = fVar8 + fVar11;
          lVar30 = lVar30 + 4;
        } while (lVar30 < (long)p_Var27);
      }
      if ((long)p_Var27 < IVar18) {
        do {
          local_5a0.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data
          [(long)p_Var27] = pfVar29[(long)p_Var27] + *(float *)((long)_Var17 + (long)p_Var27 * 4);
          p_Var27 = (_Storage<int,_true> *)((long)p_Var27 + 1);
        } while ((_Storage<int,_true> *)IVar18 != p_Var27);
      }
      free((void *)_local_638);
      if (local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      morphablemodel::sample_to_mesh
                ((Mesh *)&local_638,&local_5a0,local_450,local_458,local_460,local_468,local_470);
      pMVar20 = local_508.vertices.
                super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pMVar12 = local_508.vertices.
                super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar31 = local_640;
      local_508.vertices.
      super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)_local_638;
      local_508.vertices.
      super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_630;
      local_508.vertices.
      super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_628;
      _local_638 = (_Optional_payload_base<int>)0x0;
      uStack_630 = (_Storage<int,_true> *)0x0;
      local_628 = (pointer)0x0;
      if ((_Optional_payload_base<int>)pMVar12 != (_Optional_payload_base<int>)0x0) {
        operator_delete(pMVar12,(long)pMVar20 - (long)pMVar12);
      }
      pMVar20 = local_508.colors.
                super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_508.colors.
      super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44(fStack_614,fStack_618);
      local_508.colors.
      super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pMStack_620;
      pMVar12 = (pointer)CONCAT44(fStack_60c,fStack_610);
      pMStack_620 = (pointer)0x0;
      fStack_618 = 0.0;
      fStack_614 = 0.0;
      fStack_610 = 0.0;
      fStack_60c = 0.0;
      if (pMVar20 != (pointer)0x0) {
        uVar32 = (long)local_508.colors.
                       super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pMVar20;
        local_508.colors.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar12;
        operator_delete(pMVar20,uVar32);
        pMVar12 = local_508.colors.
                  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      local_508.colors.
      super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar12;
      pMVar28 = local_508.texcoords.
                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pMVar16 = local_508.texcoords.
                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_508.texcoords.
      super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_608;
      local_508.texcoords.
      super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Stack_600;
      local_508.texcoords.
      super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_5f8;
      local_608 = (pointer)0x0;
      _Stack_600 = (_Optional_payload_base<float>)0x0;
      local_5f8._M_payload = (_Storage<float,_true>)0x0;
      local_5f8._M_engaged = false;
      local_5f8._5_3_ = 0;
      if (pMVar16 != (pointer)0x0) {
        operator_delete(pMVar16,(long)pMVar28 - (long)pMVar16);
      }
      paVar22 = local_508.tvi.
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      paVar21 = local_508.tvi.
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_508.tvi.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = paStack_5f0;
      local_508.tvi.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = paStack_5e8;
      local_508.tvi.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_5e0;
      paStack_5f0 = (pointer)0x0;
      paStack_5e8 = (pointer)0x0;
      local_5e0 = (pointer)0x0;
      if (paVar21 != (pointer)0x0) {
        operator_delete(paVar21,(long)paVar22 - (long)paVar21);
      }
      paVar22 = local_508.tci.
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      paVar21 = local_508.tci.
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_508.tci.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_5d8;
      local_508.tci.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = paStack_5d0;
      local_508.tci.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_5c8;
      local_5d8 = (pointer)0x0;
      paStack_5d0 = (pointer)0x0;
      local_5c8 = (pointer)0x0;
      if (paVar21 != (pointer)0x0) {
        operator_delete(paVar21,(long)paVar22 - (long)paVar21);
      }
      paVar22 = local_508.tti.
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      paVar21 = local_508.tti.
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_508.tti.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_5c0;
      local_508.tti.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = paStack_5b8;
      local_508.tti.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_5b0;
      local_5c0 = (pointer)0x0;
      paStack_5b8 = (pointer)0x0;
      local_5b0 = (pointer)0x0;
      if ((paVar21 != (pointer)0x0) &&
         (operator_delete(paVar21,(long)paVar22 - (long)paVar21), local_5c0 != (pointer)0x0)) {
        operator_delete(local_5c0,(long)local_5b0 - (long)local_5c0);
      }
      if (local_5d8 != (pointer)0x0) {
        operator_delete(local_5d8,(long)local_5c8 - (long)local_5d8);
      }
      if (paStack_5f0 != (pointer)0x0) {
        operator_delete(paStack_5f0,(long)local_5e0 - (long)paStack_5f0);
      }
      if (local_608 != (pointer)0x0) {
        operator_delete(local_608,(long)local_5f8 - (long)local_608);
      }
      if (pMStack_620 != (pointer)0x0) {
        operator_delete(pMStack_620,CONCAT44(fStack_60c,fStack_610) - (long)pMStack_620);
      }
      if (_local_638 != (_Optional_payload_base<int>)0x0) {
        operator_delete((void *)_local_638,(long)local_628 - (long)_local_638);
      }
      std::
      vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ::vector(&local_360,&local_658);
      std::vector<int,_std::allocator<int>_>::vector(&local_378,&local_678);
      local_510 = (float)(int)-uVar19;
      local_1e8 = CONCAT44((float)local_58c,(float)(int)uVar19);
      uStack_1e0 = 0;
      local_3c0 = &contour_landmarks->left_contour;
      local_540 = (_Optional_payload_base<int>)
                  ((ulong)local_540 | (ulong)local_580 & 0xffffffff |
                  ((ulong)pvVar31 & 0xff) << 0x20);
      iVar33 = 0;
      while( true ) {
        local_50c = iVar33;
        std::
        vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ::operator=(&local_658,&local_360);
        std::vector<int,_std::allocator<int>_>::operator=(&local_678,&local_378);
        RenderingParameters::get_yaw_pitch_roll((RenderingParameters *)&local_638);
        local_55c._M_value = local_638._M_value;
        RenderingParameters::get_modelview((Matrix4f *)local_438,(RenderingParameters *)local_2e8);
        RenderingParameters::get_projection(&local_1d8,(RenderingParameters *)local_2e8);
        local_538 = (undefined1  [4])0x0;
        fStack_534 = (float)local_1e8;
        fStack_530 = (float)((ulong)local_1e8 >> 0x20);
        fStack_52c = local_510;
        get_contour_correspondences
                  ((tuple<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::vector<int,_std::allocator<int>_>_>
                    *)&local_638,(LandmarkCollection<Eigen::Vector2f> *)local_588,contour_landmarks,
                   model_contour,(float)local_55c,&local_508,(Matrix4f *)local_438,&local_1d8,
                   (Vector4f *)local_538,7.5);
        filter = _Stack_600;
        lVar30 = (long)uStack_630;
        local_640 = local_608;
        local_440._0_4_ = local_5f8._M_payload;
        local_440._4_1_ = local_5f8._M_engaged;
        local_440._5_3_ = local_5f8._5_3_;
        local_608 = (pointer)0x0;
        _Stack_600._M_payload = (_Storage<float,_true>)0x0;
        _Stack_600._M_engaged = false;
        _Stack_600._5_3_ = 0;
        local_5f8._M_payload = (_Storage<float,_true>)0x0;
        local_5f8._M_engaged = false;
        local_5f8._5_3_ = 0;
        local_580 = (void *)_local_638;
        local_448 = (long)local_628;
        _local_638 = (_Optional_payload_base<int>)0x0;
        uStack_630 = (_Storage<int,_true> *)0x0;
        local_628 = (pointer)0x0;
        if ((pMStack_620 != (pointer)0x0) &&
           (operator_delete(pMStack_620,CONCAT44(fStack_60c,fStack_610) - (long)pMStack_620),
           _local_638 != (_Optional_payload_base<int>)0x0)) {
          operator_delete((void *)_local_638,(long)local_628 - (long)_local_638);
        }
        _local_638 = (_Optional_payload_base<int>)0x0;
        uStack_630 = (_Storage<int,_true> *)0x0;
        local_628 = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::reserve
                  ((vector<int,_std::allocator<int>_> *)&local_638,
                   (lVar30 - (long)local_580 >> 2) +
                   ((long)local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2));
        std::vector<int,std::allocator<int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  ((vector<int,std::allocator<int>> *)&local_638,uStack_630,
                   local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        std::vector<int,std::allocator<int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  ((vector<int,std::allocator<int>> *)&local_638,uStack_630,local_580,lVar30);
        iVar33 = local_58c;
        piVar15 = local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        piVar14 = local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)_local_638;
        local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)uStack_630;
        local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)local_628;
        if ((Nested)piVar14 != (Nested)0x0) {
          operator_delete(piVar14,(long)piVar15 - (long)piVar14);
        }
        _local_638 = (_Optional_payload_base<int>)0x0;
        uStack_630 = (_Storage<int,_true> *)0x0;
        local_628 = (pointer)0x0;
        std::
        vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ::reserve((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   *)&local_638,
                  ((long)filter - (long)local_640 >> 3) +
                  ((long)local_658.
                         super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_658.
                         super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3));
        std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<Eigen::Matrix<float,2,1,0,2,1>const*,std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>>>
                  ((vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
                    *)&local_638,uStack_630,
                   local_658.
                   super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_658.
                   super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<Eigen::Matrix<float,2,1,0,2,1>const*,std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>>>
                  ((vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
                    *)&local_638,uStack_630,local_640);
        pMVar28 = local_658.
                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pMVar16 = local_658.
                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_658.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)_local_638;
        local_658.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_630;
        local_658.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_628;
        if (pMVar16 != (pointer)0x0) {
          operator_delete(pMVar16,(long)pMVar28 - (long)pMVar16);
        }
        local_538 = (undefined1  [4])0x0;
        fStack_534 = 0.0;
        fStack_530 = 0.0;
        fStack_52c = 0.0;
        local_528 = (pointer)0x0;
        if (0.0 <= (float)local_55c) {
          core::filter<Eigen::Matrix<float,2,1,0,2,1>>
                    ((LandmarkCollection<Eigen::Matrix<float,_2,_1>_> *)&local_638,local_588,
                     (LandmarkCollection<Eigen::Matrix<float,_2,_1>_> *)local_3c0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)filter);
          pMVar16 = (pointer)uStack_630;
          for (pMVar28 = (pointer)_local_638; pMVar28 != pMVar16; pMVar28 = pMVar28 + 5) {
            local_438._0_8_ =
                 *(undefined8 *)
                  pMVar28[4].super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
                  m_data.array;
            std::
            vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>::
            emplace_back<Eigen::Matrix<float,2,1,0,2,1>>
                      ((vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
                        *)local_538,(Matrix<float,_2,_1,_0,_2,_1> *)local_438);
          }
        }
        else {
          core::filter<Eigen::Matrix<float,2,1,0,2,1>>
                    ((LandmarkCollection<Eigen::Matrix<float,_2,_1>_> *)&local_638,local_588,
                     (LandmarkCollection<Eigen::Matrix<float,_2,_1>_> *)contour_landmarks,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)filter);
          pMVar16 = (pointer)uStack_630;
          for (pMVar28 = (pointer)_local_638; pMVar28 != pMVar16; pMVar28 = pMVar28 + 5) {
            local_438._0_8_ =
                 *(undefined8 *)
                  pMVar28[4].super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
                  m_data.array;
            std::
            vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>::
            emplace_back<Eigen::Matrix<float,2,1,0,2,1>>
                      ((vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
                        *)local_538,(Matrix<float,_2,_1,_0,_2,_1> *)local_438);
          }
        }
        std::
        vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
        ::~vector((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                   *)&local_638);
        find_occluding_edge_correspondences
                  ((pair<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::vector<int,_std::allocator<int>_>_>
                    *)local_438,&local_508,edge_topology,(RenderingParameters *)local_2e8,
                   (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    *)local_538,180.0,true);
        _local_638 = (_Optional_payload_base<int>)0x0;
        uStack_630 = (_Storage<int,_true> *)0x0;
        local_628 = (pointer)0x0;
        std::
        vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ::reserve((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   *)&local_638,
                  ((long)(local_438._8_8_ - local_438._0_8_) >> 3) +
                  ((long)local_658.
                         super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_658.
                         super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3));
        std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<Eigen::Matrix<float,2,1,0,2,1>const*,std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>>>
                  ((vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
                    *)&local_638,uStack_630,
                   local_658.
                   super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_658.
                   super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<Eigen::Matrix<float,2,1,0,2,1>const*,std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>>>
                  ((vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
                    *)&local_638,uStack_630,local_438._0_8_,local_438._8_8_);
        pMVar28 = local_658.
                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pMVar16 = local_658.
                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_658.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)_local_638;
        local_658.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_630;
        local_658.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_628;
        if (pMVar16 != (pointer)0x0) {
          operator_delete(pMVar16,(long)pMVar28 - (long)pMVar16);
        }
        _local_638 = (_Optional_payload_base<int>)0x0;
        uStack_630 = (_Storage<int,_true> *)0x0;
        local_628 = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::reserve
                  ((vector<int,_std::allocator<int>_> *)&local_638,
                   ((long)local_418 - (long)local_420 >> 2) +
                   ((long)local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2));
        std::vector<int,std::allocator<int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  ((vector<int,std::allocator<int>> *)&local_638,uStack_630,
                   local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        std::vector<int,std::allocator<int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  ((vector<int,std::allocator<int>> *)&local_638,uStack_630,local_420,local_418);
        piVar15 = local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        piVar14 = local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)_local_638;
        local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)uStack_630;
        local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)local_628;
        if (piVar14 != (pointer)0x0) {
          operator_delete(piVar14,(long)piVar15 - (long)piVar14);
        }
        piVar14 = local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pfVar29 = (float *)local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
        if (local_558.
            super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_558.
            super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          local_558.
          super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_558.
               super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
        for (; pfVar29 != (float *)piVar14; pfVar29 = pfVar29 + 1) {
          lVar30 = (long)(int)*pfVar29;
          _local_638 = (_Optional_payload_base<int>)
                       CONCAT44(*(undefined4 *)
                                 ((undefined1 *)
                                  ((long)local_508.vertices.
                                         super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 4) +
                                 lVar30 * 0xc),
                                *(undefined4 *)
                                 ((long)local_508.vertices.
                                        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar30 * 0xc));
          uStack_630 = (_Storage<int,_true> *)
                       CONCAT44(0x3f800000,
                                *(undefined4 *)
                                 ((long)((long)local_508.vertices.
                                               super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start + 8) +
                                 lVar30 * 0xc));
          if (local_558.
              super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_558.
              super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>::
            _M_realloc_insert<Eigen::Matrix<float,4,1,0,4,1>>
                      ((vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>
                        *)&local_558,
                       (iterator)
                       local_558.
                       super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (Matrix<float,_4,_1,_0,_4,_1> *)&local_638);
          }
          else {
            *(_Optional_payload_base<int> *)
             ((local_558.
               super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
             super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array =
                 _local_638;
            *(_Storage<int,_true> **)
             (((local_558.
                super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
              super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array +
             2) = uStack_630;
            local_558.
            super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_558.
                 super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        std::
        vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ::vector(&local_390,&local_658);
        std::
        vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
        ::vector(&local_228,&local_558);
        uVar19 = local_560;
        estimate_orthographic_projection_linear
                  ((ScaledOrthoProjectionParameters *)&local_638,&local_390,&local_228,true,
                   (optional<int>)local_3b8);
        local_3d8 = fStack_618;
        local_3e8 = local_628;
        pMStack_3e0 = pMStack_620;
        local_3f8 = (Nested)_local_638;
        pMStack_3f0 = (Nested)uStack_630;
        local_3cc = fStack_60c;
        fStack_3d0 = fStack_610;
        local_3d4 = fStack_614;
        if (local_228.
            super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_228.
                          super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_228.
                                super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_228.
                                super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_390.
            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_390.
                          super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_390.
                                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_390.
                                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        local_178 = local_3d8;
        local_188 = local_3e8;
        pMStack_180 = pMStack_3e0;
        local_198 = local_3f8;
        pMStack_190 = pMStack_3f0;
        local_16c = local_3cc;
        local_174 = local_3d4;
        fStack_170 = fStack_3d0;
        RenderingParameters::RenderingParameters
                  ((RenderingParameters *)&local_638,(ScaledOrthoProjectionParameters *)&local_198,
                   iVar33,uVar19);
        local_2d8 = local_628._0_4_;
        local_2e8._0_8_ = _local_638;
        local_2e8._8_8_ = uStack_630;
        local_2c8[1] = fStack_614;
        local_2c8[0] = fStack_618;
        afStack_2c0[1] = fStack_60c;
        afStack_2c0[0] = fStack_610;
        local_2a8 = local_5f8;
        paStack_2a0 = paStack_5f0;
        local_2b8 = local_608;
        _Stack_2b0 = _Stack_600;
        local_128 = local_628._0_4_;
        local_138 = (Nested)_local_638;
        pMStack_130 = (Nested)uStack_630;
        local_f8 = local_5f8;
        paStack_f0 = paStack_5f0;
        local_108 = local_608;
        _Stack_100 = _Stack_600;
        local_118 = local_2c8;
        afStack_110 = afStack_2c0;
        get_3x4_affine_camera_matrix
                  ((Matrix<float,_3,_4,_0,_3,_4> *)&local_1d8,(RenderingParameters *)&local_138,
                   iVar33,uVar19);
        _Var17 = local_5a8;
        if (*(char *)((long)local_5a8 + 0x140) == '\0') {
          std::__throw_bad_optional_access();
        }
        std::vector<float,_std::allocator<float>_>::vector(&local_240,expression_coefficients);
        morphablemodel::draw_sample((morphablemodel *)&local_3b0,local_568,&local_240);
        _local_638 = _Var17;
        uStack_630 = (_Storage<int,_true> *)&local_3b0;
        if (*(long *)((long)_Var17 + 8) != local_3a8) break;
        Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::Matrix<float,_1,1,0,_1,1>const>>
                  ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&local_3a0,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                    *)&local_638);
        free(local_3b0);
        if (local_240.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_240.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_240.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_240.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [0] = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0];
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [1] = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[1];
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [2] = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[2];
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [3] = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[3];
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [4] = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[4];
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [5] = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[5];
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [6] = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[6];
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [7] = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[7];
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [8] = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[8];
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [9] = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[9];
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [10] = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[10];
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [0xb] = local_1d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0xb];
        Eigen::DenseStorage<float,_-1,_-1,_1,_0>::DenseStorage(&local_1f8,&local_3a0);
        fit_shape_to_landmarks_linear
                  ((vector<float,_std::allocator<float>_> *)&local_638,(PcaModel *)_Var17,&local_168
                   ,&local_658,&local_678,(VectorXf *)&local_1f8,local_514,(optional<int>)local_540,
                   (optional<float>)0x0,(optional<float>)0x0);
        pfVar3 = (pca_shape_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        pfVar4 = (pca_shape_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
        (pca_shape_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)_local_638;
        (pca_shape_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)uStack_630;
        (pca_shape_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_628;
        _local_638 = (_Optional_payload_base<int>)0x0;
        uStack_630 = (_Storage<int,_true> *)0x0;
        local_628 = (pointer)0x0;
        if ((pfVar3 != (pointer)0x0) &&
           (operator_delete(pfVar3,(long)pfVar4 - (long)pfVar3),
           _local_638 != (_Optional_payload_base<int>)0x0)) {
          operator_delete((void *)_local_638,(long)local_628 - (long)_local_638);
        }
        free(local_1f8.m_data);
        std::vector<float,_std::allocator<float>_>::vector(&local_258,pca_shape_coefficients);
        morphablemodel::PcaModel::draw_sample
                  ((PcaModel *)&local_638,(vector<float,_std::allocator<float>_> *)_Var17);
        IVar18 = local_578.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows;
        pfVar29 = local_578.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data;
        local_578.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (float *)_local_638;
        local_578.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             (Index)uStack_630;
        _local_638 = (_Optional_payload_base<int>)pfVar29;
        uStack_630 = (_Storage<int,_true> *)IVar18;
        free(pfVar29);
        if (local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (*(char *)((long)_Var17 + 0x140) == '\0') {
          std::__throw_bad_optional_access();
        }
        fit_expressions((vector<float,_std::allocator<float>_> *)&local_638,local_568,&local_578,
                        (Matrix<float,_3,_4,_0,_3,_4> *)&local_1d8,&local_658,&local_678,
                        lambda_expressions,num_expression_coefficients_to_fit);
        pfVar3 = (expression_coefficients->super__Vector_base<float,_std::allocator<float>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pfVar4 = (expression_coefficients->super__Vector_base<float,_std::allocator<float>_>).
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        (expression_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)_local_638;
        (expression_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)uStack_630;
        (expression_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_628;
        local_638 = (_Storage<int,_true>)0x0;
        uStack_634._0_1_ = false;
        uStack_634._1_3_ = 0;
        uStack_630 = (_Storage<int,_true> *)0x0;
        local_628 = (pointer)0x0;
        if ((pfVar3 != (pointer)0x0) &&
           (operator_delete(pfVar3,(long)pfVar4 - (long)pfVar3),
           _local_638 != (_Optional_payload_base<int>)0x0)) {
          operator_delete((void *)_local_638,(long)local_628 - (long)_local_638);
        }
        if (*(char *)((long)_Var17 + 0x140) == '\0') {
          std::__throw_bad_optional_access();
        }
        std::vector<float,_std::allocator<float>_>::vector(&local_270,expression_coefficients);
        morphablemodel::draw_sample((morphablemodel *)&local_638,local_568,&local_270);
        IVar18 = local_578.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows;
        pfVar29 = local_578.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data;
        _Var17 = _local_638;
        if ((_Storage<int,_true> *)
            local_578.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            != uStack_630) break;
        if (local_5a0.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            != local_578.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows) {
          if (local_578.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows < 0) goto LAB_00157364;
          free(local_5a0.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
          if ((_Storage<int,_true> *)IVar18 == (_Storage<int,_true> *)0x0) {
            pfVar24 = (float *)0x0;
          }
          else {
            if ((_Storage<int,_true> *)0x3fffffffffffffff < (ulong)IVar18) {
LAB_00157336:
              puVar25 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar25 = boost::program_options::detail::cmdline::cmdline;
              __cxa_throw(puVar25,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            pfVar24 = (float *)malloc(IVar18 * 4);
            if ((_Storage<int,_true> *)0x3 < (ulong)IVar18 && ((ulong)pfVar24 & 0xf) != 0)
            goto LAB_00157383;
            if (pfVar24 == (float *)0x0) goto LAB_00157336;
          }
          local_5a0.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
               IVar18;
          local_5a0.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
               pfVar24;
        }
        p_Var27 = (_Storage<int,_true> *)(IVar18 + 3);
        if (-1 < IVar18) {
          p_Var27 = (_Storage<int,_true> *)IVar18;
        }
        p_Var27 = (_Storage<int,_true> *)((ulong)p_Var27 & 0xfffffffffffffffc);
        if (3 < IVar18) {
          lVar30 = 0;
          do {
            pfVar2 = pfVar29 + lVar30;
            fVar6 = pfVar2[1];
            fVar7 = pfVar2[2];
            fVar8 = pfVar2[3];
            pfVar24 = (float *)((long)_Var17 + lVar30 * 4);
            fVar9 = pfVar24[1];
            fVar10 = pfVar24[2];
            fVar11 = pfVar24[3];
            pfVar1 = local_5a0.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data + lVar30;
            *pfVar1 = *pfVar2 + *pfVar24;
            pfVar1[1] = fVar6 + fVar9;
            pfVar1[2] = fVar7 + fVar10;
            pfVar1[3] = fVar8 + fVar11;
            lVar30 = lVar30 + 4;
          } while (lVar30 < (long)p_Var27);
        }
        if ((long)p_Var27 < IVar18) {
          do {
            local_5a0.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [(long)p_Var27] = pfVar29[(long)p_Var27] + *(float *)((long)_Var17 + (long)p_Var27 * 4);
            p_Var27 = (_Storage<int,_true> *)((long)p_Var27 + 1);
          } while ((_Storage<int,_true> *)IVar18 != p_Var27);
        }
        free((void *)_local_638);
        if (local_270.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_270.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_270.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_270.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        morphablemodel::sample_to_mesh
                  ((Mesh *)&local_638,&local_5a0,local_450,local_458,local_460,local_468,local_470);
        pMVar20 = local_508.vertices.
                  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pMVar12 = local_508.vertices.
                  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_508.vertices.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)_local_638;
        local_508.vertices.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_630;
        local_508.vertices.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_628;
        _local_638 = (_Optional_payload_base<int>)0x0;
        uStack_630 = (_Storage<int,_true> *)0x0;
        local_628 = (pointer)0x0;
        if ((_Optional_payload_base<int>)pMVar12 != (_Optional_payload_base<int>)0x0) {
          operator_delete(pMVar12,(long)pMVar20 - (long)pMVar12);
        }
        pMVar20 = local_508.colors.
                  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_508.colors.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44(fStack_614,fStack_618);
        local_508.colors.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pMStack_620;
        pMVar12 = (pointer)CONCAT44(fStack_60c,fStack_610);
        pMStack_620 = (pointer)0x0;
        fStack_618 = 0.0;
        fStack_614 = 0.0;
        fStack_610 = 0.0;
        fStack_60c = 0.0;
        if (pMVar20 != (pointer)0x0) {
          uVar32 = (long)local_508.colors.
                         super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pMVar20;
          local_508.colors.
          super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar12;
          operator_delete(pMVar20,uVar32);
          pMVar12 = local_508.colors.
                    super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        local_508.colors.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar12;
        pMVar28 = local_508.texcoords.
                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pMVar16 = local_508.texcoords.
                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_508.texcoords.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = local_608;
        local_508.texcoords.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Stack_600;
        local_508.texcoords.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_5f8;
        local_608 = (pointer)0x0;
        _Stack_600 = (_Optional_payload_base<float>)0x0;
        local_5f8._M_payload = (_Storage<float,_true>)0x0;
        local_5f8._M_engaged = false;
        local_5f8._5_3_ = 0;
        if (pMVar16 != (pointer)0x0) {
          operator_delete(pMVar16,(long)pMVar28 - (long)pMVar16);
        }
        paVar22 = local_508.tvi.
                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
        paVar21 = local_508.tvi.
                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_508.tvi.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_start = paStack_5f0;
        local_508.tvi.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish = paStack_5e8;
        local_508.tvi.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_5e0;
        paStack_5f0 = (pointer)0x0;
        paStack_5e8 = (pointer)0x0;
        local_5e0 = (pointer)0x0;
        if (paVar21 != (pointer)0x0) {
          operator_delete(paVar21,(long)paVar22 - (long)paVar21);
        }
        paVar22 = local_508.tci.
                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
        paVar21 = local_508.tci.
                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_508.tci.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_start = local_5d8;
        local_508.tci.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish = paStack_5d0;
        local_508.tci.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_5c8;
        local_5d8 = (pointer)0x0;
        paStack_5d0 = (pointer)0x0;
        local_5c8 = (pointer)0x0;
        if (paVar21 != (pointer)0x0) {
          operator_delete(paVar21,(long)paVar22 - (long)paVar21);
        }
        paVar22 = local_508.tti.
                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
        paVar21 = local_508.tti.
                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_508.tti.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_start = local_5c0;
        local_508.tti.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish = paStack_5b8;
        local_508.tti.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_5b0;
        local_5c0 = (pointer)0x0;
        paStack_5b8 = (pointer)0x0;
        local_5b0 = (pointer)0x0;
        if ((paVar21 != (pointer)0x0) &&
           (operator_delete(paVar21,(long)paVar22 - (long)paVar21), local_5c0 != (pointer)0x0)) {
          operator_delete(local_5c0,(long)local_5b0 - (long)local_5c0);
        }
        if (local_5d8 != (pointer)0x0) {
          operator_delete(local_5d8,(long)local_5c8 - (long)local_5d8);
        }
        if (paStack_5f0 != (pointer)0x0) {
          operator_delete(paStack_5f0,(long)local_5e0 - (long)paStack_5f0);
        }
        if (local_608 != (pointer)0x0) {
          operator_delete(local_608,(long)local_5f8 - (long)local_608);
        }
        if (pMStack_620 != (pointer)0x0) {
          operator_delete(pMStack_620,CONCAT44(fStack_60c,fStack_610) - (long)pMStack_620);
        }
        if (_local_638 != (_Optional_payload_base<int>)0x0) {
          operator_delete((void *)_local_638,(long)local_628 - (long)_local_638);
        }
        free(local_3a0.m_data);
        if (local_420 != (pointer)0x0) {
          operator_delete(local_420,(long)local_410 - (long)local_420);
        }
        if ((float  [2])local_438._0_8_ != (float  [2])0x0) {
          operator_delete((void *)local_438._0_8_,(long)local_428 - local_438._0_8_);
        }
        pvVar31 = (void *)CONCAT44(fStack_534,local_538);
        if (pvVar31 != (void *)0x0) {
          operator_delete(pvVar31,(long)local_528 - (long)pvVar31);
        }
        if (local_580 != (void *)0x0) {
          operator_delete(local_580,local_448 - (long)local_580);
        }
        iVar33 = local_50c;
        if (local_640 != (void *)0x0) {
          operator_delete(local_640,local_440 - (long)local_640);
        }
        iVar33 = iVar33 + 1;
        if (iVar33 == num_iterations) {
          std::
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          ::operator=(fitted_image_points,&local_658);
          ppVar13 = local_478;
          core::Mesh::Mesh(&local_478->first,&local_508);
          (ppVar13->second).frustum.t = local_2d8;
          (ppVar13->second).camera_type = local_2e8._0_4_;
          (ppVar13->second).frustum.l = (float)local_2e8._4_4_;
          (ppVar13->second).frustum.r = (float)local_2e8._8_4_;
          (ppVar13->second).frustum.b = (float)local_2e8._12_4_;
          *(float (*) [2])
           (ppVar13->second).rotation.m_coeffs.
           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array =
               local_2c8;
          *(float (*) [2])
           ((long)(ppVar13->second).rotation.m_coeffs.
                  super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
           + 8) = afStack_2c0;
          (ppVar13->second).fov_y.super__Optional_base<float,_true,_true>._M_payload.
          super__Optional_payload_base<float> = local_2a8;
          *(pointer *)&(ppVar13->second).screen_width = paStack_2a0;
          *(pointer *)&(ppVar13->second).t_x = local_2b8;
          (ppVar13->second).t_z.super__Optional_base<float,_true,_true>._M_payload.
          super__Optional_payload_base<float> = _Stack_2b0;
          if (local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_360.
              super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_360.
                            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_360.
                                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_360.
                                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_658.
              super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_658.
                            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_658.
                                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_658.
                                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((Nested)local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (Nested)0x0) {
            operator_delete(local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_558.
              super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (Matrix<float,_4,_1,_0,_4,_1> *)0x0) {
            operator_delete(local_558.
                            super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_558.
                                  super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_558.
                                  super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_508.tti.
              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_508.tti.
                            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_508.tti.
                                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_508.tti.
                                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_508.tci.
              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_508.tci.
                            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_508.tci.
                                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_508.tci.
                                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_508.tvi.
              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_508.tvi.
                            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_508.tvi.
                                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_508.tvi.
                                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_508.texcoords.
              super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_508.texcoords.
                            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_508.texcoords.
                                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_508.texcoords.
                                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_508.colors.
              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_508.colors.
                            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_508.colors.
                                  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_508.colors.
                                  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((_Optional_payload_base<int>)
              local_508.vertices.
              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (_Optional_payload_base<int>)0x0) {
            operator_delete(local_508.vertices.
                            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_508.vertices.
                                  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_508.vertices.
                                  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          free(local_5a0.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
          free(local_578.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
          return local_478;
        }
      }
    }
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CwiseBinaryOp.h"
                ,0x74,
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::Matrix<float, -1, 1>, const Eigen::Matrix<float, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::Matrix<float, -1, 1>, Rhs = const Eigen::Matrix<float, -1, 1>]"
               );
}

Assistant:

inline std::pair<core::Mesh, fitting::RenderingParameters> fit_shape_and_pose(
    const morphablemodel::MorphableModel& morphable_model,
    const core::LandmarkCollection<Eigen::Vector2f>& landmarks, const core::LandmarkMapper& landmark_mapper,
    int image_width, int image_height, const morphablemodel::EdgeTopology& edge_topology,
    const fitting::ContourLandmarks& contour_landmarks, const fitting::ModelContour& model_contour,
    int num_iterations, cpp17::optional<int> num_shape_coefficients_to_fit, float lambda_identity,
    cpp17::optional<int> num_expression_coefficients_to_fit, cpp17::optional<float> lambda_expressions,
    std::vector<float>& pca_shape_coefficients, std::vector<float>& expression_coefficients,
    std::vector<Eigen::Vector2f>& fitted_image_points)
{
    // assert(blendshapes.size() > 0);
    assert(landmarks.size() >= 4);
    assert(image_width > 0 && image_height > 0);
    assert(num_iterations > 0); // Can we allow 0, for only the initial pose-fit?
    assert(pca_shape_coefficients.size() <= morphable_model.get_shape_model().get_num_principal_components());
    // More asserts I forgot?
    if (num_shape_coefficients_to_fit)
    {
        if (num_shape_coefficients_to_fit.value() >
            morphable_model.get_shape_model().get_num_principal_components())
        {
            throw std::runtime_error(
                "Specified more shape coefficients to fit than the given shape model contains.");
        }
    }

    using Eigen::MatrixXf;
    using Eigen::Vector2f;
    using Eigen::Vector4f;
    using Eigen::VectorXf;
    using std::vector;

    if (!num_shape_coefficients_to_fit)
    {
        num_shape_coefficients_to_fit = morphable_model.get_shape_model().get_num_principal_components();
    }

    if (pca_shape_coefficients.empty())
    {
        pca_shape_coefficients.resize(num_shape_coefficients_to_fit.value());
    }
    // Todo: This leaves the following case open: num_coeffs given is empty or defined, but the
    // pca_shape_coefficients given is != num_coeffs or the model's max-coeffs. What to do then? Handle & document!

    /*if (expression_coefficients.empty())
    {
        expression_coefficients.resize(blendshapes.size());
    }*/

    // Current mesh - either from the given coefficients, or the mean:
    VectorXf current_pca_shape = morphable_model.get_shape_model().draw_sample(pca_shape_coefficients);
    assert(morphable_model.has_separate_expression_model()); // Note: We could also just skip the expression fitting in this case.
    // Note we don't check whether the shape and expression model dimensions match.
    // Note: We're calling this in a loop, and morphablemodel::to_matrix(expression_blendshapes) now gets
    // called again in every fitting iteration.
    VectorXf current_combined_shape =
        current_pca_shape +
        draw_sample(morphable_model.get_expression_model().value(), expression_coefficients);
    auto current_mesh = morphablemodel::sample_to_mesh(
        current_combined_shape, morphable_model.get_color_model().get_mean(),
        morphable_model.get_shape_model().get_triangle_list(),
        morphable_model.get_color_model().get_triangle_list(), morphable_model.get_texture_coordinates(),
        morphable_model.get_texture_triangle_indices());

    // The 2D and 3D point correspondences used for the fitting:
    vector<Vector4f> model_points; // the points in the 3D shape model
    vector<int> vertex_indices; // their vertex indices
    vector<Vector2f> image_points; // the corresponding 2D landmark points

    // Sub-select all the landmarks which we have a mapping for (i.e. that are defined in the 3DMM),
    // and get the corresponding model points (mean if given no initial coeffs, from the computed shape otherwise):
    for (int i = 0; i < landmarks.size(); ++i)
    {
        const cpp17::optional<int> vertex_idx = core::get_vertex_index(
            landmarks[i].name, landmark_mapper, morphable_model.get_landmark_definitions());
        if (!vertex_idx) // vertex index not defined for the current landmark
        {
            continue;
        }
        model_points.emplace_back(current_mesh.vertices[vertex_idx.value()].homogeneous());
        vertex_indices.emplace_back(vertex_idx.value());
        image_points.emplace_back(landmarks[i].coordinates);
    }

    // Need to do an initial pose fit to do the contour fitting inside the loop.
    // We'll do an expression fit too, since face shapes vary quite a lot, depending on expressions.
    fitting::ScaledOrthoProjectionParameters current_pose =
        fitting::estimate_orthographic_projection_linear(image_points, model_points, true, image_height);
    fitting::RenderingParameters rendering_params(current_pose, image_width, image_height);

    const Eigen::Matrix<float, 3, 4> affine_from_ortho =
        fitting::get_3x4_affine_camera_matrix(rendering_params, image_width, image_height);
    expression_coefficients =
        fit_expressions(morphable_model.get_expression_model().value(), current_pca_shape, affine_from_ortho,
                        image_points, vertex_indices, lambda_expressions, num_expression_coefficients_to_fit);

    // Mesh with same PCA coeffs as before, but new expression fit (this is relevant if no initial blendshape coeffs have been given):
    current_combined_shape = current_pca_shape + draw_sample(morphable_model.get_expression_model().value(),
                                                             expression_coefficients);
    current_mesh = morphablemodel::sample_to_mesh(
        current_combined_shape, morphable_model.get_color_model().get_mean(),
        morphable_model.get_shape_model().get_triangle_list(),
        morphable_model.get_color_model().get_triangle_list(), morphable_model.get_texture_coordinates(),
        morphable_model.get_texture_triangle_indices());

    // The static (fixed) landmark correspondences which will stay the same throughout
    // the fitting (the inner face landmarks):
    const auto fixed_image_points = image_points;
    const auto fixed_vertex_indices = vertex_indices;

    for (int i = 0; i < num_iterations; ++i)
    {
        image_points = fixed_image_points;
        vertex_indices = fixed_vertex_indices;
        // Given the current pose, find 2D-3D contour correspondences of the front-facing face contour:
        vector<Vector2f> image_points_contour;
        vector<int> vertex_indices_contour;
        const auto yaw_angle = rendering_params.get_yaw_pitch_roll()[0];
        // For each 2D contour landmark, get the corresponding 3D vertex point and vertex id:
        std::tie(image_points_contour, std::ignore, vertex_indices_contour) =
            fitting::get_contour_correspondences(landmarks, contour_landmarks, model_contour, yaw_angle,
                                                 current_mesh, rendering_params.get_modelview(),
                                                 rendering_params.get_projection(),
                                                 fitting::get_opencv_viewport(image_width, image_height));
        // Add the contour correspondences to the set of landmarks that we use for the fitting:
        vertex_indices = fitting::concat(vertex_indices, vertex_indices_contour);
        image_points = fitting::concat(image_points, image_points_contour);

        // Fit the occluding (away-facing) contour using the detected contour LMs:
        vector<Vector2f> occluding_contour_landmarks;
        if (yaw_angle >= 0.0f) // positive yaw = subject looking to the left
        { // the left contour is the occluding one we want to use ("away-facing")
            const auto contour_landmarks_ =
                core::filter(landmarks, contour_landmarks.left_contour); // Can do this outside of the loop
            std::for_each(begin(contour_landmarks_), end(contour_landmarks_),
                          [&occluding_contour_landmarks](const auto& lm) {
                              occluding_contour_landmarks.push_back({lm.coordinates[0], lm.coordinates[1]});
                          });
        } else
        {
            const auto contour_landmarks_ = core::filter(landmarks, contour_landmarks.right_contour);
            std::for_each(begin(contour_landmarks_), end(contour_landmarks_),
                          [&occluding_contour_landmarks](const auto& lm) {
                              occluding_contour_landmarks.push_back({lm.coordinates[0], lm.coordinates[1]});
                          });
        }
        const auto edge_correspondences = fitting::find_occluding_edge_correspondences(
            current_mesh, edge_topology, rendering_params, occluding_contour_landmarks, 180.0f);
        image_points = fitting::concat(image_points, edge_correspondences.first);
        vertex_indices = fitting::concat(vertex_indices, edge_correspondences.second);

        // Get the model points of the current mesh, for all correspondences that we've got:
        model_points.clear();
        for (auto v : vertex_indices)
        {
            model_points.push_back({current_mesh.vertices[v][0], current_mesh.vertices[v][1],
                                    current_mesh.vertices[v][2], 1.0f});
        }

        // Re-estimate the pose, using all correspondences:
        current_pose =
            fitting::estimate_orthographic_projection_linear(image_points, model_points, true, image_height);
        rendering_params = fitting::RenderingParameters(current_pose, image_width, image_height);

        const Eigen::Matrix<float, 3, 4> affine_from_ortho =
            fitting::get_3x4_affine_camera_matrix(rendering_params, image_width, image_height);

        // Estimate the PCA shape coefficients with the current blendshape coefficients:
        const VectorXf mean_plus_expressions =
            morphable_model.get_shape_model().get_mean() +
            draw_sample(morphable_model.get_expression_model().value(), expression_coefficients);
        pca_shape_coefficients = fitting::fit_shape_to_landmarks_linear(
            morphable_model.get_shape_model(), affine_from_ortho, image_points, vertex_indices,
            mean_plus_expressions, lambda_identity, num_shape_coefficients_to_fit);

        // Estimate the blendshape coefficients with the current PCA model estimate:
        current_pca_shape = morphable_model.get_shape_model().draw_sample(pca_shape_coefficients);
        expression_coefficients = fit_expressions(
            morphable_model.get_expression_model().value(), current_pca_shape, affine_from_ortho,
            image_points, vertex_indices, lambda_expressions, num_expression_coefficients_to_fit);

        current_combined_shape =
            current_pca_shape +
            draw_sample(morphable_model.get_expression_model().value(), expression_coefficients);
        current_mesh = morphablemodel::sample_to_mesh(
            current_combined_shape, morphable_model.get_color_model().get_mean(),
            morphable_model.get_shape_model().get_triangle_list(),
            morphable_model.get_color_model().get_triangle_list(), morphable_model.get_texture_coordinates(),
            morphable_model.get_texture_triangle_indices());
    }

    fitted_image_points = image_points;
    return {current_mesh, rendering_params}; // I think we could also work with a VectorXf face_instance in
                                             // this function instead of a Mesh, but it would convolute the
                                             // code more (i.e. more complicated to access vertices).
}